

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionQueue.cpp
# Opt level: O2

bool __thiscall
llbuild::basic::ExecutionQueue::executeShellCommand
          (ExecutionQueue *this,QueueJobContext *context,StringRef command)

{
  ProcessStatus PVar1;
  ArrayRef<llvm::StringRef> commandLine_00;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  SmallString<1024U> commandStorage;
  undefined8 local_478 [2];
  char *local_468;
  undefined8 local_460;
  char *local_458;
  size_t local_450;
  StringRef *local_448;
  long lStack_440;
  undefined8 local_438;
  SmallVector<char,_1024U> local_428;
  
  llvm::SmallVector<char,1024u>::SmallVector<char_const*,void>
            (&local_428,command.Data,command.Data + command.Length);
  local_478[0] = DefaultShellPath_abi_cxx11_._0_8_;
  local_478[1] = DefaultShellPath_abi_cxx11_._8_8_;
  local_468 = "-c";
  local_460 = 2;
  local_458 = llvm::SmallString<1024U>::c_str((SmallString<1024U> *)&local_428);
  if (local_458 == (char *)0x0) {
    local_450 = 0;
  }
  else {
    local_450 = strlen(local_458);
  }
  local_448 = (StringRef *)0x0;
  lStack_440 = 0;
  local_438 = 0;
  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
  _M_range_initialize<llvm::StringRef_const*>
            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_448,local_478);
  commandLine_00.Length = lStack_440 - (long)local_448 >> 4;
  commandLine_00.Data = local_448;
  PVar1 = executeProcess(this,context,commandLine_00);
  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
            ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_448);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl(&local_428.super_SmallVectorImpl<char>);
  return PVar1 == Succeeded;
}

Assistant:

bool ExecutionQueue::executeShellCommand(QueueJobContext* context,
                                         StringRef command) {
  SmallString<1024> commandStorage(command);
  std::vector<StringRef> commandLine(
#if defined(_WIN32)
      {"C:\\windows\\system32\\cmd.exe", "/C", commandStorage.c_str()});
#else
      {DefaultShellPath, "-c", commandStorage.c_str()});
#endif
  return executeProcess(context, commandLine) == ProcessStatus::Succeeded;
}

ExecutionQueueDelegate::~ExecutionQueueDelegate() {
}